

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

DdNode * cuddHashTableLookup(DdHashTable *hash,DdNodePtr *key)

{
  DdNode *pDVar1;
  bool bVar2;
  uint uVar3;
  DdNode *value;
  int equal;
  DdNodePtr *key2;
  uint keysize;
  uint i;
  DdHashItem *prev;
  DdHashItem *item;
  uint posn;
  DdNodePtr *key_local;
  DdHashTable *hash_local;
  
  uVar3 = ddLCHash(key,hash->keysize,hash->shift);
  prev = hash->bucket[uVar3];
  _keysize = (DdHashItem *)0x0;
  do {
    if (prev == (DdHashItem *)0x0) {
      return (DdNode *)0x0;
    }
    bVar2 = true;
    for (key2._4_4_ = 0; key2._4_4_ < hash->keysize; key2._4_4_ = key2._4_4_ + 1) {
      if (key[key2._4_4_] != prev->key[key2._4_4_]) {
        bVar2 = false;
        break;
      }
    }
    if (bVar2) {
      pDVar1 = prev->value;
      prev->count = prev->count + -1;
      if (prev->count != 0) {
        return pDVar1;
      }
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
      if (_keysize == (DdHashItem *)0x0) {
        hash->bucket[uVar3] = prev->next;
      }
      else {
        _keysize->next = prev->next;
      }
      prev->next = hash->nextFree;
      hash->nextFree = prev;
      hash->size = hash->size - 1;
      return pDVar1;
    }
    _keysize = prev;
    prev = prev->next;
  } while( true );
}

Assistant:

DdNode *
cuddHashTableLookup(
  DdHashTable * hash,
  DdNodePtr * key)
{
    unsigned int posn;
    DdHashItem *item, *prev;
    unsigned int i, keysize;

#ifdef DD_DEBUG
    assert(hash->keysize > 3);
#endif

    posn = ddLCHash(key,hash->keysize,hash->shift);
    item = hash->bucket[posn];
    prev = NULL;

    keysize = hash->keysize;
    while (item != NULL) {
        DdNodePtr *key2 = item->key;
        int equal = 1;
        for (i = 0; i < keysize; i++) {
            if (key[i] != key2[i]) {
                equal = 0;
                break;
            }
        }
        if (equal) {
            DdNode *value = item->value;
            cuddSatDec(item->count);
            if (item->count == 0) {
                cuddDeref(value);
                if (prev == NULL) {
                    hash->bucket[posn] = item->next;
                } else {
                    prev->next = item->next;
                }
                item->next = hash->nextFree;
                hash->nextFree = item;
                hash->size--;
            }
            return(value);
        }
        prev = item;
        item = item->next;
    }
    return(NULL);

}